

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_l3_ur.c
# Opt level: O2

int picnic_l3_ur_write_public_key(picnic_l3_ur_publickey_t *key,uint8_t *buf,size_t buflen)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  
  if (buflen < 0x31 || (buf == (uint8_t *)0x0 || key == (picnic_l3_ur_publickey_t *)0x0)) {
    return -1;
  }
  *buf = '\x04';
  uVar1 = *(undefined8 *)(key->data + 8);
  uVar2 = *(undefined8 *)(key->data + 0x10);
  uVar3 = *(undefined8 *)(key->data + 0x18);
  uVar4 = *(undefined8 *)(key->data + 0x10);
  uVar5 = *(undefined8 *)(key->data + 0x18);
  uVar6 = *(undefined8 *)(key->data + 0x20);
  uVar7 = *(undefined8 *)(key->data + 0x28);
  *(undefined8 *)(buf + 1) = *(undefined8 *)key->data;
  *(undefined8 *)(buf + 9) = uVar1;
  *(undefined8 *)(buf + 0x11) = uVar2;
  *(undefined8 *)(buf + 0x19) = uVar3;
  *(undefined8 *)(buf + 0x11) = uVar4;
  *(undefined8 *)(buf + 0x19) = uVar5;
  *(undefined8 *)(buf + 0x21) = uVar6;
  *(undefined8 *)(buf + 0x29) = uVar7;
  return 0x31;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_l3_ur_write_public_key(const picnic_l3_ur_publickey_t* key,
                                                            uint8_t* buf, size_t buflen) {
  if (!key || !buf) {
    return -1;
  }

  if (buflen < PUBLIC_KEY_SIZE) {
    return -1;
  }

  buf[0] = PARAM;
  memcpy(buf + 1, key->data, PUBLIC_KEY_SIZE - 1);
  return PUBLIC_KEY_SIZE;
}